

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

void Gia_Iso3Test(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *local_30;
  Vec_Int_t *vSign;
  abctime clk;
  int This;
  int Prev;
  int i;
  int nIterMax;
  Gia_Man_t *p_local;
  
  Prev = 500;
  clk._4_4_ = 0xffffffff;
  _i = p;
  vSign = (Vec_Int_t *)Abc_Clock();
  local_30 = (Vec_Int_t *)0x0;
  Gia_Iso3Init(_i);
  for (This = 0; This < Prev; This = This + 1) {
    local_30 = Gia_Iso3Save(_i);
    uVar2 = Vec_IntUniqueCount(local_30,1,(Vec_Int_t **)0x0);
    iVar1 = This;
    clk._0_4_ = uVar2;
    uVar3 = Vec_IntSize(local_30);
    printf("Iter %3d : %6d  out of %6d  ",(ulong)(uint)iVar1,(ulong)uVar2,(ulong)uVar3);
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar4 - (long)vSign);
    if ((uint)clk == clk._4_4_) break;
    clk._4_4_ = (uint)clk;
    Gia_Iso3Compute(_i,local_30);
    Vec_IntFreeP(&local_30);
  }
  Vec_IntFreeP(&local_30);
  return;
}

Assistant:

void Gia_Iso3Test( Gia_Man_t * p )
{
    int nIterMax = 500;
    int i, Prev = -1, This; 
    abctime clk = Abc_Clock();
    Vec_Int_t * vSign = NULL;
    Gia_Iso3Init( p );
    for ( i = 0; i < nIterMax; i++ )
    {
        vSign = Gia_Iso3Save( p );
//        This = Gia_Iso3Unique( vSign );
        This = Vec_IntUniqueCount( vSign, 1, NULL );
        printf( "Iter %3d : %6d  out of %6d  ", i, This, Vec_IntSize(vSign) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( This == Prev )
            break;
        Prev = This;
        Gia_Iso3Compute( p, vSign );
        Vec_IntFreeP( &vSign );
    }
    Vec_IntFreeP( &vSign );
}